

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

Result __thiscall
presolve::HPresolve::equalityRowAddition<HighsTripletPositionSlice>
          (HPresolve *this,HighsPostsolveStack *postsolve_stack,HighsInt stayrow,HighsInt removerow,
          double scale,HighsMatrixSlice<HighsTripletPositionSlice> *rowvector)

{
  bool bVar1;
  uint row;
  reference piVar2;
  reference pvVar3;
  reference pvVar4;
  HighsInt in_ECX;
  int in_EDX;
  HPresolve *in_RDI;
  double in_XMM0_Qa;
  double dVar5;
  HighsCDouble HVar6;
  Result __result;
  HighsInt pos;
  HighsInt rowiter;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  vector<int,_std::allocator<int>_> stay_rowpositions;
  HighsInt in_stack_0000073c;
  HighsPostsolveStack *in_stack_00000740;
  HPresolve *in_stack_00000748;
  HighsCDouble *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  double in_stack_fffffffffffffe98;
  HighsCDouble *in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffeb0;
  HPresolve *in_stack_fffffffffffffeb8;
  HighsInt HVar7;
  value_type vVar8;
  HighsInt col;
  HighsMatrixSlice<HighsTripletPositionSlice> *eqRowVec;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  HighsInt in_stack_ffffffffffffff28;
  HighsInt in_stack_ffffffffffffff2c;
  HighsPostsolveStack *in_stack_ffffffffffffff30;
  double local_b8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff50;
  HighsInt in_stack_ffffffffffffff5c;
  HPresolve *in_stack_ffffffffffffff60;
  HighsCDouble local_88;
  uint local_78;
  int local_74;
  int *local_70;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_68;
  HighsMatrixSlice<HighsTripletPositionSlice> *local_60;
  HighsMatrixSlice<HighsTripletPositionSlice> local_48;
  double local_28;
  HighsInt local_20;
  int local_1c;
  Result local_4;
  
  eqRowVec = &local_48;
  local_28 = in_XMM0_Qa;
  local_20 = in_ECX;
  local_1c = in_EDX;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x727d8b);
  getRowPositions(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50);
  HighsPostsolveStack::equalityRowAddition<HighsTripletPositionSlice>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,
             (double)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),eqRowVec);
  local_60 = &local_48;
  local_68._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe88);
  local_70 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe88);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                            (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            in_stack_fffffffffffffe88), bVar1) {
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_68);
    local_74 = *piVar2;
    col = local_20;
    std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->Acol,(long)local_74);
    row = findNonzero(in_stack_fffffffffffffeb8,(HighsInt)((ulong)in_stack_fffffffffffffeb0 >> 0x20)
                      ,(HighsInt)in_stack_fffffffffffffeb0);
    local_78 = row;
    if (row == 0xffffffff) {
      HVar7 = local_20;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->Acol,(long)local_74);
      vVar8 = *pvVar3;
      std::vector<double,_std::allocator<double>_>::operator[](&in_RDI->Avalue,(long)local_74);
      addToMatrix(in_RDI,row,col,(double)CONCAT44(vVar8,HVar7));
    }
    else {
      unlink(in_RDI,(char *)(ulong)row);
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_68);
  }
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&in_RDI->model->row_upper_,(long)local_20);
  if ((*pvVar4 != INFINITY) || (NAN(*pvVar4))) {
    std::vector<double,_std::allocator<double>_>::operator[]
              (&in_RDI->model->row_upper_,(long)local_20);
    HighsCDouble::HighsCDouble((HighsCDouble *)&stack0xffffffffffffff58,local_28);
    std::vector<double,_std::allocator<double>_>::operator[]
              (&in_RDI->model->row_upper_,(long)local_1c);
    HighsCDouble::operator*(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    local_88 = ::operator+((double)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                           in_stack_fffffffffffffe88);
    dVar5 = HighsCDouble::operator_cast_to_double(&local_88);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->model->row_upper_,(long)local_20);
    *pvVar4 = dVar5;
  }
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&in_RDI->model->row_lower_,(long)local_20);
  if ((*pvVar4 != -INFINITY) || (NAN(*pvVar4))) {
    std::vector<double,_std::allocator<double>_>::operator[]
              (&in_RDI->model->row_lower_,(long)local_20);
    HighsCDouble::HighsCDouble((HighsCDouble *)&stack0xffffffffffffff28,local_28);
    std::vector<double,_std::allocator<double>_>::operator[]
              (&in_RDI->model->row_upper_,(long)local_1c);
    HighsCDouble::operator*(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    HVar6 = ::operator+((double)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                        in_stack_fffffffffffffe88);
    in_stack_fffffffffffffea0 = (HighsCDouble *)HVar6.lo;
    local_b8 = HVar6.hi;
    dVar5 = HighsCDouble::operator_cast_to_double((HighsCDouble *)&local_b8);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->model->row_lower_,(long)local_20);
    *pvVar4 = dVar5;
  }
  local_4 = rowPresolve(in_stack_00000748,in_stack_00000740,in_stack_0000073c);
  if (local_4 == kOk) {
    local_4 = kOk;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffea0);
  return local_4;
}

Assistant:

HPresolve::Result HPresolve::equalityRowAddition(
    HighsPostsolveStack& postsolve_stack, HighsInt stayrow, HighsInt removerow,
    double scale, const HighsMatrixSlice<RowStorageFormat>& rowvector) {
  // extract non-zero positions
  std::vector<HighsInt> stay_rowpositions;
  getRowPositions(stayrow, stay_rowpositions);

  // update postsolve information
  postsolve_stack.equalityRowAddition(removerow, stayrow, scale, rowvector);

  // iterate over non-zero positions instead of iterating over the
  // HighsMatrixSlice because the latter contains pointers to Acol and Avalue
  // that may be invalidated if these vectors are reallocated
  // (see std::vector::push_back performed in HPresolve::addToMatrix).
  for (HighsInt rowiter : stay_rowpositions) {
    HighsInt pos = findNonzero(removerow, Acol[rowiter]);
    if (pos != -1)
      unlink(pos);  // all common nonzeros are cancelled, as the rows are
                    // parallel
    else            // might introduce a singleton
      addToMatrix(removerow, Acol[rowiter], scale * Avalue[rowiter]);
  }

  if (model->row_upper_[removerow] != kHighsInf)
    model->row_upper_[removerow] = static_cast<double>(
        model->row_upper_[removerow] +
        static_cast<HighsCDouble>(scale) * model->row_upper_[stayrow]);
  if (model->row_lower_[removerow] != -kHighsInf)
    model->row_lower_[removerow] = static_cast<double>(
        model->row_lower_[removerow] +
        static_cast<HighsCDouble>(scale) * model->row_upper_[stayrow]);

  // row is now a singleton row, doubleton equation, or a row
  // that contains only singletons and we let the normal row presolve
  // handle the cases
  HPRESOLVE_CHECKED_CALL(rowPresolve(postsolve_stack, removerow));
  return Result::kOk;
}